

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steed.c
# Opt level: O0

boolean landing_spot(coord *spot,int reason,int forceit)

{
  boolean bVar1;
  int iVar2;
  int iVar3;
  trap *ptVar4;
  obj *poVar5;
  trap *t;
  boolean found;
  int min_distance;
  int distance;
  int y;
  int x;
  int i;
  int forceit_local;
  int reason_local;
  coord *spot_local;
  
  y = 0;
  t._4_4_ = -1;
  t._3_1_ = '\0';
  if (((((reason != 6) || (u.uprops[0x1b].intrinsic != 0)) || (u.umonnum == 0x9e)) ||
      (((youmonst.data)->mlet == '\x1c' || (u.uprops[0x1c].intrinsic != 0)))) ||
     ((u.uprops[0x25].intrinsic != 0 || (u.uprops[0x25].extrinsic != 0)))) {
    y = 1;
  }
  for (; t._3_1_ == '\0' && y < 2; y = y + 1) {
    for (distance = u.ux + -1; distance <= u.ux + 1; distance = distance + 1) {
      for (min_distance = u.uy + -1; min_distance <= u.uy + 1; min_distance = min_distance + 1) {
        if (((((0 < distance) && (distance < 0x50)) && (-1 < min_distance)) &&
            (((min_distance < 0x15 && ((distance != u.ux || (min_distance != u.uy)))) &&
             (('\x16' < level->locations[distance][min_distance].typ &&
              ((level->monsters[distance][min_distance] == (monst *)0x0 ||
               ((*(uint *)&level->monsters[distance][min_distance]->field_0x60 >> 9 & 1) != 0)))))))
            ) && ((bVar1 = closed_door(level,distance,min_distance), bVar1 == '\0' &&
                  ((((iVar2 = dist2(distance,min_distance,(int)u.ux,(int)u.uy), t._4_4_ < 0 ||
                     (iVar2 < t._4_4_)) || ((iVar2 == t._4_4_ && (iVar3 = rn2(2), iVar3 != 0)))) &&
                   ((0 < y || (((ptVar4 = t_at(level,distance,min_distance), ptVar4 == (trap *)0x0
                                || (((byte)ptVar4->field_0x8 >> 5 & 1) == 0)) &&
                               ((poVar5 = sobj_at(0x214,level,distance,min_distance),
                                poVar5 == (obj *)0x0 ||
                                (((youmonst.data)->mflags2 & 0x8000000) != 0)))))))))))) {
          spot->x = (xchar)distance;
          spot->y = (xchar)min_distance;
          t._3_1_ = '\x01';
          t._4_4_ = iVar2;
        }
      }
    }
  }
  if (((forceit == 0) || (-1 < t._4_4_)) ||
     (bVar1 = enexto(spot,level,u.ux,u.uy,youmonst.data), bVar1 != '\0')) {
    spot_local._7_1_ = t._3_1_;
  }
  else {
    spot_local._7_1_ = '\0';
  }
  return spot_local._7_1_;
}

Assistant:

static boolean landing_spot(coord *spot, /* landing position (we fill it in) */
			    int reason, 
			    int forceit)
{
    int i = 0, x, y, distance, min_distance = -1;
    boolean found = FALSE;
    struct trap *t;

    /* avoid known traps (i == 0) and boulders, but allow them as a backup */
    if (reason != DISMOUNT_BYCHOICE || Stunned || Confusion || Fumbling) i = 1;
    for (; !found && i < 2; ++i) {
	for (x = u.ux-1; x <= u.ux+1; x++)
	    for (y = u.uy-1; y <= u.uy+1; y++) {
		if (!isok(x, y) || (x == u.ux && y == u.uy)) continue;

		if (ACCESSIBLE(level->locations[x][y].typ) &&
			    !MON_AT(level, x,y) && !closed_door(level, x,y)) {
		    distance = distu(x,y);
		    if (min_distance < 0 || distance < min_distance ||
			    (distance == min_distance && rn2(2))) {
			if (i > 0 || (((t = t_at(level, x, y)) == 0 || !t->tseen) &&
				      (!sobj_at(BOULDER, level, x, y) ||
				       throws_rocks(youmonst.data)))) {
			    spot->x = x;
			    spot->y = y;
			    min_distance = distance;
			    found = TRUE;
			}
		    }
		}
	    }
    }

    /* If we didn't find a good spot and forceit is on, try enexto(). */
    if (forceit && min_distance < 0 &&
		!enexto(spot, level, u.ux, u.uy, youmonst.data))
	return FALSE;

    return found;
}